

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  printer *ppVar1;
  colors *pcVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  printer *this_00;
  __string_type local_58;
  char local_31;
  unsigned_long local_30;
  char local_21;
  unsigned_long local_20;
  reporter<boost::ext::ut::v1_1_8::printer> *local_18;
  reporter<boost::ext::ut::v1_1_8::printer> *this_local;
  
  if (on::once) {
    on::once = false;
    local_18 = this;
    if (((this->tests_).fail == 0) && ((this->asserts_).fail == 0)) {
      pcVar2 = printer::colors(&this->printer_);
      __str._M_len = (pcVar2->pass)._M_len;
      __str._M_str = (pcVar2->pass)._M_str;
      pbVar4 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,__str);
      poVar3 = std::operator<<(pbVar4,"All tests passed");
      pcVar2 = printer::colors(&this->printer_);
      __str_00._M_len = (pcVar2->none)._M_len;
      __str_00._M_str = (pcVar2->none)._M_str;
      pbVar4 = std::operator<<(poVar3,__str_00);
      poVar3 = std::operator<<(pbVar4," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->asserts_).pass);
      poVar3 = std::operator<<(poVar3," asserts in ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->tests_).pass);
      std::operator<<(poVar3," tests)\n");
      if ((this->tests_).skip != 0) {
        poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(this->tests_).skip);
        std::operator<<(poVar3," tests skipped\n");
      }
      std::ostream::flush();
    }
    else {
      this_00 = &this->printer_;
      ppVar1 = printer::operator<<(this_00,(char (*) [82])
                                           "\n===============================================================================\n"
                                  );
      ppVar1 = printer::operator<<(ppVar1,(char (*) [10])"tests:   ");
      local_20 = (this->tests_).pass + (this->tests_).fail;
      ppVar1 = printer::operator<<(ppVar1,&local_20);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [4])" | ");
      pcVar2 = printer::colors(this_00);
      ppVar1 = printer::operator<<(ppVar1,&pcVar2->fail);
      ppVar1 = printer::operator<<(ppVar1,&(this->tests_).fail);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [8])" failed");
      pcVar2 = printer::colors(this_00);
      ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
      local_21 = '\n';
      ppVar1 = printer::operator<<(ppVar1,&local_21);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [10])"asserts: ");
      local_30 = (this->asserts_).pass + (this->asserts_).fail;
      ppVar1 = printer::operator<<(ppVar1,&local_30);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [4])" | ");
      ppVar1 = printer::operator<<(ppVar1,&(this->asserts_).pass);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [8])0xc7849c);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [4])" | ");
      pcVar2 = printer::colors(this_00);
      ppVar1 = printer::operator<<(ppVar1,&pcVar2->fail);
      ppVar1 = printer::operator<<(ppVar1,&(this->asserts_).fail);
      ppVar1 = printer::operator<<(ppVar1,(char (*) [8])" failed");
      pcVar2 = printer::colors(this_00);
      ppVar1 = printer::operator<<(ppVar1,&pcVar2->none);
      local_31 = '\n';
      printer::operator<<(ppVar1,&local_31);
      printer::str_abi_cxx11_(&local_58,this_00);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_58);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return;
}

Assistant:

auto on(events::summary) -> void {
      if (static auto once = true; once) {
        once = false;
        if (tests_.fail or asserts_.fail) {
          printer_
              << "\n========================================================"
                 "=======================\n"
              << "tests:   " << (tests_.pass + tests_.fail) << " | "
              << printer_.colors().fail << tests_.fail << " failed"
              << printer_.colors().none << '\n'
              << "asserts: " << (asserts_.pass + asserts_.fail) << " | "
              << asserts_.pass << " passed"
              << " | " << printer_.colors().fail << asserts_.fail << " failed"
              << printer_.colors().none << '\n';
          std::cerr << printer_.str() << std::endl;
        } else {
          std::cout << printer_.colors().pass << "All tests passed"
                    << printer_.colors().none << " (" << asserts_.pass
                    << " asserts in " << tests_.pass << " tests)\n";

          if (tests_.skip) {
            std::cout << tests_.skip << " tests skipped\n";
          }

          std::cout.flush();
        }
      }
    }